

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  long lVar3;
  long lVar4;
  uint *local_78;
  size_type local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  text *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = __return_storage_ptr__;
  if ((this->opt).verbose == false) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    if (local_78 != &local_68) {
LAB_00110976:
      (local_58->_M_dataplus)._M_p = (pointer)local_78;
      (local_58->field_2)._M_allocated_capacity = CONCAT44(uStack_64,local_68);
      __return_storage_ptr__ = local_58;
      goto LAB_00110996;
    }
  }
  else {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = local_68 & 0xffffff00;
    pbVar2 = (this->ctx).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->ctx).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pbVar2) {
      paVar1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    }
    else {
      lVar3 = 0;
      lVar4 = 0;
      do {
        std::operator+(&local_50,"\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        lVar4 = lVar4 + 1;
        pbVar2 = (this->ctx).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x20;
      } while (lVar4 != (long)(this->ctx).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      paVar1 = &local_58->field_2;
      (local_58->_M_dataplus)._M_p = (pointer)paVar1;
      __return_storage_ptr__ = local_58;
      if (local_78 != &local_68) goto LAB_00110976;
    }
  }
  *(uint *)paVar1 = local_68;
  *(undefined4 *)((long)paVar1 + 4) = uStack_64;
  *(undefined4 *)((long)paVar1 + 8) = uStack_60;
  *(undefined4 *)((long)paVar1 + 0xc) = uStack_5c;
LAB_00110996:
  __return_storage_ptr__->_M_string_length = local_70;
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }